

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsLinSys(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix A,int jok,int *jcur,sunrealtype gamma,
              void *cvode_mem,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 *in_R8;
  undefined8 in_XMM0_Qa;
  ulong in_XMM1_Qa;
  undefined8 in_stack_00000008;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  CVodeMem local_50;
  int local_4;
  
  iVar1 = cvLs_AccessLMem(in_stack_ffffffffffffffa8,
                          (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98,(CVLsMem *)0x11f4da);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (in_ECX == 0) {
    *in_R8 = 1;
    iVar1 = SUNLinSolGetType(*(undefined8 *)((long)in_stack_ffffffffffffffa8 + 0x48));
    if ((iVar1 == 0) && (iVar1 = SUNMatZero(in_RDX), iVar1 != 0)) {
      cvProcessError(local_50,-8,0x544,"cvLsLinSys",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                     ,"A SUNMatrix routine failed in an unrecoverable manner.");
      *(undefined4 *)((long)in_stack_ffffffffffffffa8 + 0x138) = 0xfffffff8;
      return *(int *)((long)in_stack_ffffffffffffffa8 + 0x138);
    }
    iVar1 = (**(code **)((long)in_stack_ffffffffffffffa8 + 0x10))
                      (in_XMM0_Qa,in_RDI,in_RSI,in_RDX,
                       *(undefined8 *)((long)in_stack_ffffffffffffffa8 + 0x18),in_stack_00000008,
                       cvls_mem,cv_mem);
    if (iVar1 < 0) {
      cvProcessError(local_50,-6,0x54f,"cvLsLinSys",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                     ,"The Jacobian routine failed in an unrecoverable manner.");
      *(undefined4 *)((long)in_stack_ffffffffffffffa8 + 0x138) = 0xfffffffa;
      return -1;
    }
    if (0 < iVar1) {
      *(undefined4 *)((long)in_stack_ffffffffffffffa8 + 0x138) = 0xfffffff9;
      return 1;
    }
    iVar1 = SUNMatCopy(in_RDX,*(undefined8 *)((long)in_stack_ffffffffffffffa8 + 0x58));
    if (iVar1 != 0) {
      cvProcessError(local_50,-8,0x55e,"cvLsLinSys",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                     ,"A SUNMatrix routine failed in an unrecoverable manner.");
      *(undefined4 *)((long)in_stack_ffffffffffffffa8 + 0x138) = 0xfffffff8;
      return *(int *)((long)in_stack_ffffffffffffffa8 + 0x138);
    }
  }
  else {
    *in_R8 = 0;
    iVar1 = SUNMatCopy(*(undefined8 *)((long)in_stack_ffffffffffffffa8 + 0x58),in_RDX);
    if (iVar1 != 0) {
      cvProcessError(local_50,-8,0x533,"cvLsLinSys",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                     ,"A SUNMatrix routine failed in an unrecoverable manner.");
      *(undefined4 *)((long)in_stack_ffffffffffffffa8 + 0x138) = 0xfffffff8;
      return *(int *)((long)in_stack_ffffffffffffffa8 + 0x138);
    }
  }
  iVar1 = SUNMatScaleAddI(in_XMM1_Qa ^ 0x8000000000000000,in_RDX);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    cvProcessError(local_50,-8,0x569,"cvLsLinSys",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_ls.c"
                   ,"A SUNMatrix routine failed in an unrecoverable manner.");
    *(undefined4 *)((long)in_stack_ffffffffffffffa8 + 0x138) = 0xfffffff8;
    local_4 = *(int *)((long)in_stack_ffffffffffffffa8 + 0x138);
  }
  return local_4;
}

Assistant:

static int cvLsLinSys(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix A,
                      sunbooleantype jok, sunbooleantype* jcur,
                      sunrealtype gamma, void* cvode_mem, N_Vector vtemp1,
                      N_Vector vtemp2, N_Vector vtemp3)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Check if Jacobian needs to be updated */
  if (jok)
  {
    /* Use saved copy of J */
    *jcur = SUNFALSE;

    /* Overwrite linear system matrix with saved J */
    retval = SUNMatCopy(cvls_mem->savedJ, A);
    if (retval)
    {
      cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                     MSG_LS_SUNMAT_FAILED);
      cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
      return (cvls_mem->last_flag);
    }
  }
  else
  {
    /* Call jac() routine to update J */
    *jcur = SUNTRUE;

    /* Clear the linear system matrix if necessary */
    if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_DIRECT)
    {
      retval = SUNMatZero(A);
      if (retval)
      {
        cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                       MSG_LS_SUNMAT_FAILED);
        cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
        return (cvls_mem->last_flag);
      }
    }

    /* Compute new Jacobian matrix */
    retval = cvls_mem->jac(t, y, fy, A, cvls_mem->J_data, vtemp1, vtemp2, vtemp3);
    if (retval < 0)
    {
      cvProcessError(cv_mem, CVLS_JACFUNC_UNRECVR, __LINE__, __func__, __FILE__,
                     MSG_LS_JACFUNC_FAILED);
      cvls_mem->last_flag = CVLS_JACFUNC_UNRECVR;
      return (-1);
    }
    if (retval > 0)
    {
      cvls_mem->last_flag = CVLS_JACFUNC_RECVR;
      return (1);
    }

    /* Update saved copy of the Jacobian matrix */
    retval = SUNMatCopy(A, cvls_mem->savedJ);
    if (retval)
    {
      cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                     MSG_LS_SUNMAT_FAILED);
      cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
      return (cvls_mem->last_flag);
    }
  }

  /* Perform linear combination A = I - gamma*J */
  retval = SUNMatScaleAddI(-gamma, A);
  if (retval)
  {
    cvProcessError(cv_mem, CVLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_SUNMAT_FAILED);
    cvls_mem->last_flag = CVLS_SUNMAT_FAIL;
    return (cvls_mem->last_flag);
  }

  return (CVLS_SUCCESS);
}